

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O2

void __thiscall
slang::parsing::Preprocessor::handleProtectLicense
          (Preprocessor *this,Token keyword,PragmaExpressionSyntax *args,
          SmallVectorBase<slang::parsing::Token> *param_3)

{
  SyntaxNode *pSVar1;
  bool bVar2;
  SyntaxNode *pSVar3;
  Diagnostic *pDVar4;
  SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *__range2;
  SyntaxNode **ppSVar5;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __y_01;
  basic_string_view<char,_std::char_traits<char>_> __y_02;
  basic_string_view<char,_std::char_traits<char>_> __y_03;
  string_view sVar6;
  SourceRange SVar7;
  string_view arg;
  Token keyword_local;
  const_iterator __begin2;
  
  keyword_local.info = keyword.info;
  keyword_local._0_8_ = keyword._0_8_;
  if (args == (PragmaExpressionSyntax *)0x0) {
    SVar7 = Token::range(&keyword_local);
  }
  else {
    if (((args->super_SyntaxNode).kind == ParenPragmaExpression) &&
       (pSVar1 = args[3].super_SyntaxNode.previewNode, pSVar1 != (SyntaxNode *)0x0)) {
      ppSVar5 = &args[1].super_SyntaxNode.previewNode;
      __begin2.index = 0;
      __begin2.list = (ParentList *)ppSVar5;
      do {
        if (__begin2.list == (ParentList *)ppSVar5 &&
            __begin2.index == (ulong)((long)&pSVar1->kind + 1) >> 1) {
          return;
        }
        pSVar3 = &slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::
                  iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>::dereference
                            (&__begin2)->super_SyntaxNode;
        if (pSVar3->kind == NameValuePragmaExpression) {
          sVar6 = Token::valueText((Token *)(pSVar3 + 1));
          __y._M_str = "library";
          __y._M_len = 7;
          bVar2 = std::operator==(sVar6,__y);
          if ((((bVar2) ||
               (__y_00._M_str = "entry", __y_00._M_len = 5, bVar2 = std::operator==(sVar6,__y_00),
               bVar2)) ||
              (__y_01._M_str = "feature", __y_01._M_len = 7, bVar2 = std::operator==(sVar6,__y_01),
              bVar2)) ||
             (__y_02._M_str = "exit", __y_02._M_len = 4, bVar2 = std::operator==(sVar6,__y_02),
             bVar2)) {
            pSVar3 = pSVar3[2].parent;
            if ((pSVar3->kind != SimplePragmaExpression) ||
               ((short)pSVar3[1].kind != AcceptOnPropertyExpr)) {
              SVar7 = slang::syntax::SyntaxNode::sourceRange(pSVar3);
              pDVar4 = addDiag(this,(DiagCode)0x1f0004,SVar7);
              goto LAB_00269d14;
            }
          }
          else {
            __y_03._M_str = "match";
            __y_03._M_len = 5;
            bVar2 = std::operator==(sVar6,__y_03);
            if (bVar2) {
              requireUInt32(this,(PragmaExpressionSyntax *)pSVar3[2].parent);
            }
            else if (sVar6._M_len != 0) {
              SVar7 = Token::range((Token *)(pSVar3 + 1));
              pDVar4 = addDiag(this,(DiagCode)0x2e0004,SVar7);
              arg = Token::valueText(&keyword_local);
              pDVar4 = Diagnostic::operator<<(pDVar4,arg);
              goto LAB_00269d14;
            }
          }
        }
        else {
          SVar7 = slang::syntax::SyntaxNode::sourceRange(pSVar3);
          pDVar4 = addDiag(this,(DiagCode)0x270004,SVar7);
          sVar6 = Token::valueText(&keyword_local);
LAB_00269d14:
          Diagnostic::operator<<(pDVar4,sVar6);
        }
        __begin2.index = __begin2.index + 1;
      } while( true );
    }
    SVar7 = slang::syntax::SyntaxNode::sourceRange(&args->super_SyntaxNode);
  }
  pDVar4 = addDiag(this,(DiagCode)0x270004,SVar7);
  sVar6 = Token::valueText(&keyword_local);
  Diagnostic::operator<<(pDVar4,sVar6);
  return;
}

Assistant:

void Preprocessor::handleProtectLicense(Token keyword, const PragmaExpressionSyntax* args,
                                        SmallVectorBase<Token>&) {
    if (!args || args->kind != SyntaxKind::ParenPragmaExpression ||
        args->as<ParenPragmaExpressionSyntax>().values.empty()) {
        addDiag(diag::ProtectArgList, args ? args->sourceRange() : keyword.range())
            << keyword.valueText();
        return;
    }

    for (auto arg : args->as<ParenPragmaExpressionSyntax>().values) {
        if (arg->kind != SyntaxKind::NameValuePragmaExpression) {
            addDiag(diag::ProtectArgList, arg->sourceRange()) << keyword.valueText();
            continue;
        }

        auto& nvp = arg->as<NameValuePragmaExpressionSyntax>();
        auto name = nvp.name.valueText();
        if (name == "library"sv || name == "entry"sv || name == "feature"sv || name == "exit"sv) {
            if (nvp.value->kind != SyntaxKind::SimplePragmaExpression ||
                nvp.value->as<SimplePragmaExpressionSyntax>().value.kind !=
                    TokenKind::StringLiteral) {
                addDiag(diag::ExpectedProtectArg, nvp.value->sourceRange()) << name;
            }
        }
        else if (name == "match"sv) {
            requireUInt32(*nvp.value);
        }
        else if (!name.empty()) {
            addDiag(diag::UnknownProtectOption, nvp.name.range()) << keyword.valueText() << name;
        }
    }
}